

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_send(ptls_t *tls,ptls_buffer_t *sendbuf,void *input,size_t inlen)

{
  st_ptls_traffic_protection_t *enc;
  byte bVar1;
  size_t sVar2;
  uint8_t *puVar3;
  bool bVar4;
  ptls_buffer_t *buf;
  ptls_buffer_t *ppVar5;
  int iVar6;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  bool bVar10;
  ptls_message_emitter_t local_60;
  undefined8 local_38;
  
  if ((tls->traffic_protection).enc.aead == (ptls_aead_context_t *)0x0) {
    __assert_fail("tls->traffic_protection.enc.aead != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                  ,0x17ff,"int ptls_send(ptls_t *, ptls_buffer_t *, const void *, size_t)");
  }
  if ((0xffffff < (tls->traffic_protection).enc.seq) &&
     (tls->key_schedule != (ptls_key_schedule_t *)0x0)) {
    tls->field_0x1e8 = tls->field_0x1e8 | 8;
  }
  enc = &(tls->traffic_protection).enc;
  bVar1 = tls->field_0x1e8;
  if ((bVar1 & 8) == 0) goto LAB_00114b96;
  local_60.record_header_length = 5;
  local_60.begin_message = begin_record_message;
  local_60.commit_message = commit_record_message;
  local_38 = 0;
  sVar2 = sendbuf->off;
  local_60.buf = sendbuf;
  local_60.enc = enc;
  iVar6 = begin_record_message(&local_60);
  buf = local_60.buf;
  if (iVar6 == 0) {
    iVar6 = ptls_buffer_reserve_aligned(local_60.buf,1,'\0');
    if (iVar6 == 0) {
      buf->base[buf->off] = '\x18';
      buf->off = buf->off + 1;
      iVar6 = 0;
    }
    bVar10 = true;
    if (iVar6 == 0) {
      iVar6 = ptls_buffer_reserve_aligned(buf,3,'\0');
      ppVar5 = local_60.buf;
      if (iVar6 == 0) {
        puVar3 = buf->base;
        sVar8 = buf->off;
        puVar3[sVar8 + 2] = '\0';
        puVar3 = puVar3 + sVar8;
        puVar3[0] = '\0';
        puVar3[1] = '\0';
        buf->off = buf->off + 3;
        iVar6 = 0;
      }
      if (iVar6 != 0) goto LAB_00114b3f;
      sVar8 = buf->off;
      iVar6 = ptls_buffer_reserve_aligned(local_60.buf,1,'\0');
      if (iVar6 == 0) {
        ppVar5->base[ppVar5->off] = bVar1 >> 4 & 1;
        ppVar5->off = ppVar5->off + 1;
        iVar6 = 0;
      }
      if (iVar6 != 0) goto LAB_00114b3f;
      uVar9 = buf->off - sVar8;
      if (0xffffff < uVar9) {
        iVar6 = 0x20c;
        goto LAB_00114b3f;
      }
      lVar7 = 0x10;
      bVar10 = false;
      do {
        buf->base[sVar8 - 3] = (uint8_t)(uVar9 >> ((byte)lVar7 & 0x3f));
        lVar7 = lVar7 + -8;
        sVar8 = sVar8 + 1;
        bVar4 = true;
        iVar6 = 0;
      } while (lVar7 != -8);
    }
    else {
LAB_00114b3f:
      bVar4 = false;
    }
    if (bVar4) {
      iVar6 = (*local_60.commit_message)(&local_60);
      bVar10 = iVar6 != 0;
    }
  }
  else {
    bVar10 = true;
  }
  if (bVar10) {
LAB_00114b72:
    if (iVar6 != 0) {
      (local_60.buf)->off = sVar2;
    }
  }
  else if (!bVar10) {
    iVar6 = update_traffic_key(tls,1);
    goto LAB_00114b72;
  }
  if (iVar6 != 0) {
    return iVar6;
  }
  tls->field_0x1e8 = tls->field_0x1e8 & 0xe7;
LAB_00114b96:
  iVar6 = buffer_push_encrypted_records(sendbuf,'\x17',(uint8_t *)input,inlen,enc);
  return iVar6;
}

Assistant:

int ptls_send(ptls_t *tls, ptls_buffer_t *sendbuf, const void *input, size_t inlen)
{
    assert(tls->traffic_protection.enc.aead != NULL);

    /* "For AES-GCM, up to 2^24.5 full-size records (about 24 million) may be encrypted on a given connection while keeping a
     * safety margin of approximately 2^-57 for Authenticated Encryption (AE) security." (RFC 8446 section 5.5).
     *
     * Key updates do not happen with tls 1.2, check `key_schedule` to see if we are using tls/1.3
     */
    if (tls->traffic_protection.enc.seq >= 16777216 && tls->key_schedule != NULL)
        tls->needs_key_update = 1;

    if (tls->needs_key_update) {
        int ret;
        if ((ret = update_send_key(tls, sendbuf, tls->key_update_send_request)) != 0)
            return ret;
        tls->needs_key_update = 0;
        tls->key_update_send_request = 0;
    }

    return buffer_push_encrypted_records(sendbuf, PTLS_CONTENT_TYPE_APPDATA, input, inlen, &tls->traffic_protection.enc);
}